

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O3

void LoadWalls(walltype *walls,int numwalls,sectortype *bsec)

{
  double *pdVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  short sVar6;
  ushort uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  FTextureID FVar12;
  FTextureID FVar13;
  size_t __n;
  long lVar14;
  line_t *plVar15;
  side_t *psVar16;
  vertex_t *pvVar17;
  long lVar18;
  DWORD DVar19;
  ulong uVar20;
  side_t *psVar21;
  long lVar22;
  size_t sVar23;
  long lVar24;
  int linenum;
  ulong uVar25;
  BYTE *pBVar26;
  SWORD *pSVar27;
  double dVar28;
  int iVar29;
  double dVar30;
  char tnam [9];
  SlopeWork local_a8;
  
  numlines = 0;
  uVar20 = (ulong)numwalls;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar20;
  __n = SUB168(auVar9 * ZEXT816(0xd8),0);
  sVar23 = __n;
  if (SUB168(auVar9 * ZEXT816(0xd8),8) != 0) {
    sVar23 = 0xffffffffffffffff;
  }
  numvertexes = numwalls;
  numsides = numwalls;
  sides = (side_t *)operator_new__(sVar23);
  memset(sides,0,__n);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar20;
  uVar25 = 0xffffffffffffffff;
  if (SUB168(auVar10 * ZEXT816(0x38),8) == 0) {
    uVar25 = SUB168(auVar10 * ZEXT816(0x38),0);
  }
  vertexes = (vertex_t *)operator_new__(uVar25);
  if (numwalls != 0) {
    pvVar17 = vertexes;
    do {
      (pvVar17->p).X = 0.0;
      (pvVar17->p).Y = 0.0;
      pvVar17->viewangle = 0;
      pvVar17->angletime = 0;
      pvVar17->dirty = true;
      pvVar17->numheights = 0;
      pvVar17->numsectors = 0;
      pvVar17->sectors = (sector_t **)0x0;
      pvVar17->heightlist = (float *)0x0;
      pvVar17 = pvVar17 + 1;
    } while (pvVar17 != vertexes + uVar20);
  }
  numvertexes = 0;
  lVar14 = (long)numsectors;
  if (0 < lVar14) {
    lVar18 = 0;
    do {
      if ((-1 < (long)bsec[lVar18].wallptr) && (lVar22 = (long)bsec[lVar18].wallnum, 0 < lVar22)) {
        lVar24 = (long)bsec[lVar18].wallptr * 0xd8;
        do {
          *(sector_t **)((long)sides->textures + lVar24 + -0x10) = sectors + lVar18;
          lVar24 = lVar24 + 0xd8;
          lVar22 = lVar22 + -1;
        } while (lVar22 != 0);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar14);
  }
  if (numwalls < 1) {
    lines = (line_t *)operator_new__(0);
  }
  else {
    pBVar26 = &walls->xpanning;
    lVar14 = 0xb4;
    psVar21 = (side_t *)0x0;
    do {
      mysnprintf((char *)&local_a8,9,"BTIL%04d");
      FVar12 = FTextureManager::GetTexture(&TexMan,(char *)&local_a8,5,0);
      mysnprintf((char *)&local_a8,9,"BTIL%04d");
      FVar13 = FTextureManager::GetTexture(&TexMan,(char *)&local_a8,5,0);
      psVar16 = sides;
      dVar28 = (double)(*(uint *)pBVar26 & 0xff);
      dVar30 = (double)(*(uint *)pBVar26 >> 8 & 0xff);
      pdVar1 = (double *)((long)sides->textures + lVar14 + -0x54);
      *pdVar1 = dVar28;
      pdVar1[1] = dVar30;
      pdVar1 = (double *)((long)psVar16 + lVar14 + -0x74);
      *pdVar1 = dVar28;
      pdVar1[1] = dVar30;
      pdVar1 = (double *)((long)psVar16 + lVar14 + -0xa4);
      *pdVar1 = dVar28;
      pdVar1[1] = dVar30;
      *(int *)((long)psVar16 + lVar14 + -0x84) = FVar12.texnum;
      *(int *)((long)psVar16->textures + lVar14 + -0x34) = FVar12.texnum;
      if ((*(short *)(pBVar26 + -0xc) < 0) || ((*(ushort *)(pBVar26 + -10) & 0x20) != 0)) {
        *(int *)((long)psVar16->textures + lVar14 + -100) = FVar12.texnum;
      }
      else if ((*(ushort *)(pBVar26 + -10) & 0x10) == 0) {
        *(undefined4 *)((long)psVar16->textures + lVar14 + -100) = 0;
      }
      else {
        *(int *)((long)psVar16->textures + lVar14 + -100) = FVar13.texnum;
      }
      *(ushort *)((long)psVar16->textures + lVar14 + -0x14) = (ushort)pBVar26[-2] << 3;
      uVar20 = -(ulong)((double)pBVar26[-1] * 0.125 == 0.0);
      uVar20 = ~uVar20 & (ulong)((double)pBVar26[-1] * 0.125) | uVar20 & 0x3ff0000000000000;
      *(ulong *)((long)psVar16->textures + lVar14 + -0x3c) = uVar20;
      *(ulong *)((long)psVar16->textures + lVar14 + -0x6c) = uVar20;
      *(ulong *)((long)psVar16 + lVar14 + -0x8c) = uVar20;
      *(undefined8 *)((long)psVar16->textures + lVar14 + -0x44) = 0x3ff0000000000000;
      *(undefined8 *)((long)psVar16->textures + lVar14 + -0x74) = 0x3ff0000000000000;
      *(undefined8 *)((long)psVar16 + lVar14 + -0x94) = 0x3ff0000000000000;
      *(short *)((long)psVar16->textures + lVar14 + -0x12) =
           0xff - ((short)(char)pBVar26[-4] + (short)(char)pBVar26[-4]);
      *(undefined1 *)((long)psVar16->textures + lVar14 + -0x10) = 1;
      sVar6 = *(short *)(pBVar26 + -0x10);
      *(int *)((long)psVar16->textures + lVar14 + -0x18) = (int)sVar6;
      psVar16[sVar6].LeftSide = (DWORD)psVar21;
      lVar18 = (long)*(short *)(pBVar26 + -0xe);
      if ((long)psVar21 < lVar18 || lVar18 < 0) {
        plVar15 = (line_t *)(long)numlines;
        numlines = numlines + 1;
      }
      else {
        plVar15 = psVar16[lVar18].linedef;
      }
      *(line_t **)((long)psVar16->textures + lVar14 + -0x24) = plVar15;
      psVar21 = (side_t *)((long)&psVar21->sector + 1);
      lVar14 = lVar14 + 0xd8;
      pBVar26 = pBVar26 + 0x20;
    } while ((side_t *)(ulong)(uint)numwalls != psVar21);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (long)numlines;
    sVar23 = SUB168(auVar11 * ZEXT816(0x98),0);
    uVar20 = 0xffffffffffffffff;
    if (SUB168(auVar11 * ZEXT816(0x98),8) == 0) {
      uVar20 = sVar23;
    }
    lines = (line_t *)operator_new__(uVar20);
    memset(lines,0,sVar23);
    if (0 < numwalls) {
      pSVar27 = &walls->cstat;
      lVar14 = 0xa0;
      psVar21 = (side_t *)0x0;
      do {
        psVar16 = (side_t *)(long)pSVar27[-2];
        if ((long)psVar16 < 0 || (long)psVar21 < (long)psVar16) {
          iVar29 = *(int *)((long)sides->textures + lVar14 + -0x10);
          lines[iVar29].sidedef[0] = psVar21;
          lines[iVar29].sidedef[1] = psVar16;
          pvVar17 = FindVertex(((walltype *)(pSVar27 + -7))->x,*(SDWORD *)(pSVar27 + -5));
          lines[iVar29].v1 = pvVar17;
          pvVar17 = FindVertex(walls[pSVar27[-3]].x,walls[pSVar27[-3]].y);
          lines[iVar29].v2 = pvVar17;
          lines[iVar29].frontsector = *(sector_t **)((long)sides + lVar14 + -0xa0);
          plVar15 = lines;
          lines[iVar29].flags = lines[iVar29].flags | 0x100000;
          if ((long)pSVar27[-1] < 0) {
            plVar15[iVar29].backsector = (sector_t *)0x0;
            plVar15 = lines;
          }
          else {
            plVar15[iVar29].backsector = sectors + pSVar27[-1];
            plVar15 = lines;
            lines[iVar29].flags = lines[iVar29].flags | 4;
          }
          P_AdjustLine(plVar15 + iVar29);
          uVar7 = *pSVar27;
          if ((char)uVar7 < '\0') {
            lines[iVar29].alpha = *(double *)(&DAT_007455f0 + (ulong)((uVar7 >> 9 & 1) == 0) * 8);
          }
          if ((uVar7 & 1) != 0) {
            lines[iVar29].flags = lines[iVar29].flags | 1;
          }
          if (pSVar27[-2] < 0) {
            if ((uVar7 & 4) != 0) {
              lines[iVar29].flags = lines[iVar29].flags | 0x10;
            }
          }
          else {
            uVar8 = lines[iVar29].flags;
            if ((uVar7 & 4) == 0) {
              DVar19 = uVar8 | 0x10;
            }
            else {
              DVar19 = uVar8 | 8;
            }
            lines[iVar29].flags = DVar19;
          }
          if ((uVar7 & 0x40) != 0) {
            lines[iVar29].flags = lines[iVar29].flags | 0x8000;
          }
        }
        psVar21 = (side_t *)((long)&psVar21->sector + 1);
        lVar14 = lVar14 + 0xd8;
        pSVar27 = pSVar27 + 0x10;
      } while ((side_t *)(ulong)(uint)numwalls != psVar21);
    }
  }
  if (0 < numsectors) {
    lVar18 = 0xb0;
    lVar14 = 0;
    do {
      sVar6 = bsec->wallptr;
      local_a8.wal = walls + sVar6;
      local_a8.wal2 = walls + walls[sVar6].point2;
      uVar2 = walls[walls[sVar6].point2].x;
      uVar4 = walls[walls[sVar6].point2].y;
      uVar3 = walls[sVar6].x;
      uVar5 = walls[sVar6].y;
      iVar29 = uVar4 - uVar5;
      local_a8.dx = CONCAT44(-(uint)((int)(uVar2 - uVar3) < 0),uVar2 - uVar3);
      local_a8.i = CONCAT44(-(uint)(iVar29 < 0),iVar29);
      lVar22 = CONCAT44(-(uint)(iVar29 < 0),iVar29);
      dVar28 = c_sqrt((double)(lVar22 * lVar22 + local_a8.dx * local_a8.dx));
      local_a8.i = (long)dVar28 << 5;
      if (local_a8.i != 0) {
        if (((bsec->floorstat & 2) != 0) && ((long)bsec->floorheinum != 0)) {
          local_a8.heinum = -(long)bsec->floorheinum;
          local_a8.z[0] = -(long)bsec->floorZ;
          local_a8.z[1] = local_a8.z[0];
          local_a8.z[2] = local_a8.z[0];
          CalcPlane(&local_a8,(secplane_t *)((long)&sectors->planes[0].xform.xOffs + lVar18));
        }
        if (((bsec->ceilingstat & 2) != 0) && ((long)bsec->ceilingheinum != 0)) {
          local_a8.heinum = -(long)bsec->ceilingheinum;
          local_a8.z[0] = -(long)bsec->ceilingZ;
          local_a8.z[1] = local_a8.z[0];
          local_a8.z[2] = local_a8.z[0];
          CalcPlane(&local_a8,(secplane_t *)((long)&sectors->planes[0].xform.Angle.Degrees + lVar18)
                   );
        }
        linenum = (int)sides[bsec->wallptr].linedef;
        iVar29 = *(int *)(lines[linenum].sidedef + 1);
        if ((bsec->floorstat & 0x40) != 0) {
          P_AlignFlat(linenum,(uint)(iVar29 == bsec->wallptr),0);
        }
        if ((bsec->ceilingstat & 0x40) != 0) {
          P_AlignFlat(linenum,(uint)(iVar29 == bsec->wallptr),0);
        }
      }
      lVar14 = lVar14 + 1;
      bsec = bsec + 1;
      lVar18 = lVar18 + 0x268;
    } while (lVar14 < numsectors);
  }
  lVar14 = (long)numlines;
  if (0 < lVar14) {
    lVar18 = 0;
    do {
      lVar22 = *(long *)((long)lines->sidedef + lVar18);
      lVar24 = *(long *)((long)lines->sidedef + lVar18 + 8);
      psVar21 = sides + lVar22;
      if (lVar22 < 0) {
        psVar21 = (side_t *)0x0;
      }
      *(side_t **)((long)lines->sidedef + lVar18) = psVar21;
      psVar21 = sides + lVar24;
      if (lVar24 < 0) {
        psVar21 = (side_t *)0x0;
      }
      *(side_t **)((long)lines->sidedef + lVar18 + 8) = psVar21;
      lVar18 = lVar18 + 0x98;
    } while (lVar14 * 0x98 - lVar18 != 0);
  }
  lVar14 = (long)numsides;
  if (0 < lVar14) {
    lVar18 = 0;
    do {
      if (*(long *)((long)sides->textures + lVar18 + -0x10) == 0) {
        __assert_fail("sides[i].sector != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_buildmap.cpp"
                      ,0x2a5,"void LoadWalls(walltype *, int, sectortype *)");
      }
      *(line_t **)((long)&sides->linedef + lVar18) =
           lines + *(long *)((long)&sides->linedef + lVar18);
      lVar18 = lVar18 + 0xd8;
    } while (lVar14 * 0xd8 - lVar18 != 0);
  }
  return;
}

Assistant:

static void LoadWalls (walltype *walls, int numwalls, sectortype *bsec)
{
	int i, j;

	// Setting numvertexes to the same as numwalls is overly conservative,
	// but the extra vertices will be removed during the BSP building pass.
	numsides = numvertexes = numwalls;
	numlines = 0;

	sides = new side_t[numsides];
	memset (sides, 0, numsides*sizeof(side_t));

	vertexes = new vertex_t[numvertexes];
	numvertexes = 0;

	// First mark each sidedef with the sector it belongs to
	for (i = 0; i < numsectors; ++i)
	{
		if (bsec[i].wallptr >= 0)
		{
			for (j = 0; j < bsec[i].wallnum; ++j)
			{
				sides[j + bsec[i].wallptr].sector = sectors + i;
			}
		}
	}

	// Now copy wall properties to their matching sidedefs
	for (i = 0; i < numwalls; ++i)
	{
		char tnam[9];
		FTextureID overpic, pic;

		mysnprintf (tnam, countof(tnam), "BTIL%04d", LittleShort(walls[i].picnum));
		pic = TexMan.GetTexture (tnam, FTexture::TEX_Build);
		mysnprintf (tnam, countof(tnam), "BTIL%04d", LittleShort(walls[i].overpicnum));
		overpic = TexMan.GetTexture (tnam, FTexture::TEX_Build);

		walls[i].x = LittleLong(walls[i].x);
		walls[i].y = LittleLong(walls[i].y);
		walls[i].point2 = LittleShort(walls[i].point2);
		walls[i].cstat = LittleShort(walls[i].cstat);
		walls[i].nextwall = LittleShort(walls[i].nextwall);
		walls[i].nextsector = LittleShort(walls[i].nextsector);

		sides[i].SetTextureXOffset((double)walls[i].xpanning);
		sides[i].SetTextureYOffset((double)walls[i].ypanning);

		sides[i].SetTexture(side_t::top, pic);
		sides[i].SetTexture(side_t::bottom, pic);
		if (walls[i].nextsector < 0 || (walls[i].cstat & 32))
		{
			sides[i].SetTexture(side_t::mid, pic);
		}
		else if (walls[i].cstat & 16)
		{
			sides[i].SetTexture(side_t::mid, overpic);
		}
		else
		{
			sides[i].SetTexture(side_t::mid, FNullTextureID());
		}

		sides[i].TexelLength = walls[i].xrepeat * 8;
		sides[i].SetTextureYScale(walls[i].yrepeat / 8.);
		sides[i].SetTextureXScale(1.);
		sides[i].SetLight(SHADE2LIGHT(walls[i].shade));
		sides[i].Flags = WALLF_ABSLIGHTING;
		sides[i].RightSide = walls[i].point2;
		sides[walls[i].point2].LeftSide = i;

		if (walls[i].nextwall >= 0 && walls[i].nextwall <= i)
		{
			sides[i].linedef = sides[walls[i].nextwall].linedef;
		}
		else
		{
			sides[i].linedef = (line_t*)(intptr_t)(numlines++);
		}
	}

	// Set line properties that Doom doesn't store per-sidedef
	lines = new line_t[numlines];
	memset (lines, 0, numlines*sizeof(line_t));

	for (i = 0, j = -1; i < numwalls; ++i)
	{
		if (walls[i].nextwall >= 0 && walls[i].nextwall <= i)
		{
			continue;
		}

		j = int(intptr_t(sides[i].linedef));
		lines[j].sidedef[0] = (side_t*)(intptr_t)i;
		lines[j].sidedef[1] = (side_t*)(intptr_t)walls[i].nextwall;
		lines[j].v1 = FindVertex (walls[i].x, walls[i].y);
		lines[j].v2 = FindVertex (walls[walls[i].point2].x, walls[walls[i].point2].y);
		lines[j].frontsector = sides[i].sector;
		lines[j].flags |= ML_WRAP_MIDTEX;
		if (walls[i].nextsector >= 0)
		{
			lines[j].backsector = sectors + walls[i].nextsector;
			lines[j].flags |= ML_TWOSIDED;
		}
		else
		{
			lines[j].backsector = NULL;
		}
		P_AdjustLine (&lines[j]);
		if (walls[i].cstat & 128)
		{
			if (walls[i].cstat & 512)
			{
				lines[j].alpha = 1/3.;
			}
			else
			{
				lines[j].alpha = 2/3.;
			}
		}
		if (walls[i].cstat & 1)
		{
			lines[j].flags |= ML_BLOCKING;
		}
		if (walls[i].nextwall < 0)
		{
			if (walls[i].cstat & 4)
			{
				lines[j].flags |= ML_DONTPEGBOTTOM;
			}
		}
		else
		{
			if (walls[i].cstat & 4)
			{
				lines[j].flags |= ML_DONTPEGTOP;
			}
			else
			{
				lines[j].flags |= ML_DONTPEGBOTTOM;
			}
		}
		if (walls[i].cstat & 64)
		{
			lines[j].flags |= ML_BLOCKEVERYTHING;
		}
	}

	// Finish setting sector properties that depend on walls
	for (i = 0; i < numsectors; ++i, ++bsec)
	{
		SlopeWork slope;

		slope.wal = &walls[bsec->wallptr];
		slope.wal2 = &walls[slope.wal->point2];
		slope.dx = slope.wal2->x - slope.wal->x;
		slope.dy = slope.wal2->y - slope.wal->y;
		slope.i = long (g_sqrt ((double)(slope.dx*slope.dx+slope.dy*slope.dy))) << 5;
		if (slope.i == 0)
		{
			continue;
		}
		if ((bsec->floorstat & 2) && (bsec->floorheinum != 0))
		{ // floor is sloped
			slope.heinum = -LittleShort(bsec->floorheinum);
			slope.z[0] = slope.z[1] = slope.z[2] = -bsec->floorZ;
			CalcPlane (slope, sectors[i].floorplane);
		}
		if ((bsec->ceilingstat & 2) && (bsec->ceilingheinum != 0))
		{ // ceiling is sloped
			slope.heinum = -LittleShort(bsec->ceilingheinum);
			slope.z[0] = slope.z[1] = slope.z[2] = -bsec->ceilingZ;
			CalcPlane (slope, sectors[i].ceilingplane);
		}
		int linenum = int(intptr_t(sides[bsec->wallptr].linedef));
		int sidenum = int(intptr_t(lines[linenum].sidedef[1]));
		if (bsec->floorstat & 64)
		{ // floor is aligned to first wall
			P_AlignFlat (linenum, sidenum == bsec->wallptr, 0);
		}
		if (bsec->ceilingstat & 64)
		{ // ceiling is aligned to first wall
			P_AlignFlat (linenum, sidenum == bsec->wallptr, 0);
		}
	}
	for (i = 0; i < numlines; i++)
	{
		intptr_t front = intptr_t(lines[i].sidedef[0]);
		intptr_t back = intptr_t(lines[i].sidedef[1]);
		lines[i].sidedef[0] = front >= 0 ? &sides[front] : NULL;
		lines[i].sidedef[1] = back >= 0 ? &sides[back] : NULL;
	}
	for (i = 0; i < numsides; i++)
	{
		assert(sides[i].sector != NULL);
		sides[i].linedef = &lines[intptr_t(sides[i].linedef)];
	}
}